

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitStringConst(PrintExpressionContents *this,StringConst *curr)

{
  char *in_RCX;
  string_view str;
  
  printMedium(this->o,"string.const ");
  str._M_str = in_RCX;
  str._M_len = (size_t)(curr->string).super_IString.str._M_str;
  anon_unknown_217::printEscapedString
            ((anon_unknown_217 *)this->o,(ostream *)(curr->string).super_IString.str._M_len,str);
  return;
}

Assistant:

void visitStringConst(StringConst* curr) {
    printMedium(o, "string.const ");
    printEscapedString(o, curr->string.str);
  }